

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

ostream * mat_lib::operator<<(ostream *os,vector<double> *vector)

{
  bool bVar1;
  format fVar2;
  int __n;
  _Setprecision _Var3;
  ostream *poVar4;
  size_t sVar5;
  element_t eVar6;
  _func_ios_base_ptr_ios_base_ptr *local_40;
  int local_2c;
  int i;
  _func_ios_base_ptr_ios_base_ptr *formatter;
  vector<double> *vector_local;
  ostream *os_local;
  
  poVar4 = std::operator<<(os,"mat_lib::vector[");
  sVar5 = vector<double>::size(vector);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  std::operator<<(poVar4,"]{");
  bVar1 = vector<double>::is_empty(vector);
  if (bVar1) {
    std::operator<<(os,"}");
  }
  else {
    fVar2 = vector<double>::getFormat(vector);
    if (fVar2 == fixed) {
      local_40 = std::fixed;
    }
    else {
      local_40 = std::scientific;
    }
    local_2c = 0;
    while( true ) {
      sVar5 = vector<double>::size(vector);
      if (sVar5 - 1 <= (ulong)(long)local_2c) break;
      poVar4 = (ostream *)std::ostream::operator<<(os,local_40);
      __n = vector<double>::getFractionalDigits(vector);
      _Var3 = std::setprecision(__n);
      poVar4 = std::operator<<(poVar4,_Var3);
      eVar6 = vector<double>::operator[](vector,(long)local_2c);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,eVar6);
      std::operator<<(poVar4,", ");
      local_2c = local_2c + 1;
    }
    sVar5 = vector<double>::size(vector);
    eVar6 = vector<double>::operator[](vector,sVar5 - 1);
    poVar4 = (ostream *)std::ostream::operator<<(os,eVar6);
    std::operator<<(poVar4,"}");
  }
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const vector &vector) {
          os << "mat_lib::vector[" << vector.size() << "]{";

          if(vector.is_empty()){
             os << "}";
             return os;
          }

          auto formatter = vector.getFormat() == mat_lib::fixed ? std::fixed : std::scientific;
          for(int i = 0 ; i < vector.size()-1; i++)
          {
              os << formatter << setprecision(vector.getFractionalDigits()) << vector[i] << ", ";
          }
          os<< vector[vector.size()-1] << "}";
          return os;
      }